

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

common_hf_file_res * common_get_hf_file(string *hf_repo_with_tag,string *bearer_token)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  invalid_argument *this;
  pointer pvVar5;
  undefined8 uVar6;
  _func_size_t_void_ptr_size_t_size_t_void_ptr *p_Var7;
  ulong uVar8;
  runtime_error *prVar9;
  common_hf_file_res *in_RDI;
  smatch match_1;
  regex pattern_1;
  smatch match;
  regex pattern;
  string mmprojFile;
  string ggufFile;
  long res_code;
  CURLcode res;
  string auth_header;
  anon_class_1_0_00000001 write_callback;
  string url;
  string model_endpoint;
  string res_str;
  curl_slist_ptr http_headers;
  curl_ptr curl;
  string hf_repo;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  pointer in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  common_hf_file_res *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffc60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  flag_type in_stack_fffffffffffffc84;
  const_reference in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  char *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffcb4;
  char separator;
  string *in_stack_fffffffffffffcb8;
  string local_2e0 [32];
  string local_2c0 [96];
  string local_260 [8];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [32];
  long local_1b0;
  int local_1a4;
  string local_1a0 [39];
  __0 local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  curl_slist_ptr local_b8;
  code *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80 [34];
  byte local_5e;
  allocator<char> local_5d [13];
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [2];
  
  separator = (char)((uint)in_stack_fffffffffffffcb4 >> 0x18);
  string_split<std::__cxx11::string>(in_stack_fffffffffffffcb8,separator);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_30);
  local_5e = 0;
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    local_5e = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (char *)in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc50);
    std::__cxx11::string::string(local_50,(string *)pvVar4);
  }
  if ((local_5e & 1) != 0) {
    std::allocator<char>::~allocator(local_5d);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_30,0);
  std::__cxx11::string::string(local_80,(string *)pvVar4);
  string_split<std::__cxx11::string>(in_stack_fffffffffffffcb8,separator);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc60);
  if (sVar3 != 2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"error: invalid HF repo format, expected <user>/<model>[:quant]\n");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  curl_easy_init();
  local_b0 = curl_easy_cleanup;
  std::unique_ptr<void,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x1a5175);
  curl_slist_ptr::curl_slist_ptr(&local_b8);
  std::__cxx11::string::string(local_d8);
  get_model_endpoint_abi_cxx11_();
  std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
  std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
  std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  uVar6 = std::__cxx11::string::c_str();
  curl_easy_setopt(pvVar5,0x2712,uVar6);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  curl_easy_setopt(pvVar5,0x2b,1);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  p_Var7 = common_get_hf_file(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0::
           operator_cast_to_function_pointer(&local_179);
  curl_easy_setopt(pvVar5,0x4e2b,p_Var7);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  curl_easy_setopt(pvVar5,0x2711,local_d8);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffc98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    uVar6 = std::__cxx11::string::c_str();
    local_b8.ptr = (curl_slist *)curl_slist_append(local_b8.ptr,uVar6);
    std::__cxx11::string::~string(local_1a0);
  }
  local_b8.ptr = (curl_slist *)curl_slist_append(local_b8.ptr,"User-Agent: llama-cpp");
  local_b8.ptr = (curl_slist *)curl_slist_append(local_b8.ptr,"Accept: application/json");
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  curl_easy_setopt(pvVar5,0x2727,local_b8.ptr);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  local_1a4 = curl_easy_perform(pvVar5);
  if (local_1a4 != 0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"error: cannot make GET request to HF API");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (char *)in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (char *)in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  std::allocator<char>::~allocator(&local_1f9);
  pvVar5 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc50);
  curl_easy_getinfo(pvVar5,0x200002,&local_1b0);
  if (local_1b0 != 200) {
    if (local_1b0 != 0x191) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar6 = std::__cxx11::string::c_str();
      string_format_abi_cxx11_
                ((char *)local_2e0,"error from HF API, response code: %ld, data: %s",local_1b0,uVar6
                );
      std::runtime_error::runtime_error(prVar9,local_2e0);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar9,
               "error: model is private or does not exist; if you are accessing a gated model, please provide a valid HF token"
              );
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (char *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffc50);
  uVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                     (match_flag_type)((ulong)in_stack_fffffffffffffc58 >> 0x20));
  if ((bool)uVar1) {
    in_stack_fffffffffffffc88 =
         std::__cxx11::
         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(in_stack_fffffffffffffc88);
    std::__cxx11::string::operator=(local_1d0,local_260);
    std::__cxx11::string::~string(local_260);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x1a577d);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffc50);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffc90),(char *)in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc84);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffc50);
  bVar2 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                     (match_flag_type)((ulong)in_stack_fffffffffffffc58 >> 0x20));
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(in_stack_fffffffffffffc88);
    std::__cxx11::string::operator=(local_1f8,local_2c0);
    std::__cxx11::string::~string(local_2c0);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x1a588f);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffc50);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"error: model does not have ggufFile");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,local_80);
  std::__cxx11::string::string((string *)&in_RDI->ggufFile,local_1d0);
  std::__cxx11::string::string((string *)&in_RDI->mmprojFile,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  curl_slist_ptr::~curl_slist_ptr((curl_slist_ptr *)this_00);
  std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc60);
  return in_RDI;
}

Assistant:

static struct common_hf_file_res common_get_hf_file(const std::string & hf_repo_with_tag, const std::string & bearer_token) {
    auto parts = string_split<std::string>(hf_repo_with_tag, ':');
    std::string tag = parts.size() > 1 ? parts.back() : "latest";
    std::string hf_repo = parts[0];
    if (string_split<std::string>(hf_repo, '/').size() != 2) {
        throw std::invalid_argument("error: invalid HF repo format, expected <user>/<model>[:quant]\n");
    }

    // fetch model info from Hugging Face Hub API
    curl_ptr       curl(curl_easy_init(), &curl_easy_cleanup);
    curl_slist_ptr http_headers;
    std::string res_str;

    std::string model_endpoint = get_model_endpoint();

    std::string url = model_endpoint + "v2/" + hf_repo + "/manifests/" + tag;
    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 1L);
    typedef size_t(*CURLOPT_WRITEFUNCTION_PTR)(void * ptr, size_t size, size_t nmemb, void * data);
    auto write_callback = [](void * ptr, size_t size, size_t nmemb, void * data) -> size_t {
        static_cast<std::string *>(data)->append((char * ) ptr, size * nmemb);
        return size * nmemb;
    };
    curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, static_cast<CURLOPT_WRITEFUNCTION_PTR>(write_callback));
    curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, &res_str);
#if defined(_WIN32)
    curl_easy_setopt(curl.get(), CURLOPT_SSL_OPTIONS, CURLSSLOPT_NATIVE_CA);
#endif
    if (!bearer_token.empty()) {
        std::string auth_header = "Authorization: Bearer " + bearer_token;
        http_headers.ptr = curl_slist_append(http_headers.ptr, auth_header.c_str());
    }
    // Important: the User-Agent must be "llama-cpp" to get the "ggufFile" field in the response
    http_headers.ptr = curl_slist_append(http_headers.ptr, "User-Agent: llama-cpp");
    http_headers.ptr = curl_slist_append(http_headers.ptr, "Accept: application/json");
    curl_easy_setopt(curl.get(), CURLOPT_HTTPHEADER, http_headers.ptr);

    CURLcode res = curl_easy_perform(curl.get());

    if (res != CURLE_OK) {
        throw std::runtime_error("error: cannot make GET request to HF API");
    }

    long res_code;
    std::string ggufFile   = "";
    std::string mmprojFile = "";
    curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &res_code);
    if (res_code == 200) {
        // extract ggufFile.rfilename in json, using regex
        {
            std::regex pattern("\"ggufFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"");
            std::smatch match;
            if (std::regex_search(res_str, match, pattern)) {
                ggufFile = match[1].str();
            }
        }
        // extract mmprojFile.rfilename in json, using regex
        {
            std::regex pattern("\"mmprojFile\"[\\s\\S]*?\"rfilename\"\\s*:\\s*\"([^\"]+)\"");
            std::smatch match;
            if (std::regex_search(res_str, match, pattern)) {
                mmprojFile = match[1].str();
            }
        }
    } else if (res_code == 401) {
        throw std::runtime_error("error: model is private or does not exist; if you are accessing a gated model, please provide a valid HF token");
    } else {
        throw std::runtime_error(string_format("error from HF API, response code: %ld, data: %s", res_code, res_str.c_str()));
    }

    // check response
    if (ggufFile.empty()) {
        throw std::runtime_error("error: model does not have ggufFile");
    }

    return { hf_repo, ggufFile, mmprojFile };
}